

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  sqlite3 *db;
  Btree *pBVar2;
  Db *pDVar3;
  char *pcVar4;
  Schema *pSVar5;
  u8 uVar6;
  undefined6 uVar7;
  u8 uVar8;
  u8 uVar9;
  undefined6 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uchar *zUri;
  uchar *z;
  Schema *pSVar14;
  Db *pDVar15;
  char *pcVar16;
  int iDb;
  uint vfsFlags;
  long lVar17;
  undefined4 uVar18;
  Btree *pBVar19;
  undefined7 uVar20;
  char *zErrDyn;
  sqlite3_context *local_60;
  uint flags;
  undefined4 uStack_54;
  Btree **local_50;
  sqlite3_vfs *pVfs;
  char *zErr;
  char *zPath;
  
  db = context->pOut->db;
  zPath = (char *)0x0;
  zErr = (char *)0x0;
  zErrDyn = (char *)0x0;
  zUri = sqlite3_value_text(*argv);
  z = sqlite3_value_text(argv[1]);
  if (zUri == (uchar *)0x0) {
    zUri = "";
  }
  if (z == (uchar *)0x0) {
    z = "";
  }
  if (((db->init).field_0x6 & 4) == 0) {
    iVar13 = db->nDb;
    if (iVar13 < db->aLimit[7] + 2) {
      iVar12 = 0;
      iDb = 0;
      local_60 = context;
      if (0 < iVar13) {
        iVar12 = iVar13;
        iDb = 0;
      }
      do {
        if (iVar12 == iDb) {
          if (db->aDb == db->aDbStatic) {
            pDVar15 = (Db *)sqlite3DbMallocRawNN(db,0x60);
            if (pDVar15 == (Db *)0x0) {
              return;
            }
            pDVar3 = db->aDb;
            pcVar16 = pDVar3->zDbSName;
            pBVar19 = pDVar3->pBt;
            uVar8 = pDVar3->safety_level;
            uVar9 = pDVar3->bSyncSet;
            uVar10 = *(undefined6 *)&pDVar3->field_0x12;
            pSVar14 = pDVar3->pSchema;
            pcVar4 = pDVar3[1].zDbSName;
            pBVar2 = pDVar3[1].pBt;
            uVar6 = pDVar3[1].bSyncSet;
            uVar7 = *(undefined6 *)&pDVar3[1].field_0x12;
            pSVar5 = pDVar3[1].pSchema;
            pDVar15[1].safety_level = pDVar3[1].safety_level;
            pDVar15[1].bSyncSet = uVar6;
            *(undefined6 *)&pDVar15[1].field_0x12 = uVar7;
            pDVar15[1].pSchema = pSVar5;
            pDVar15[1].zDbSName = pcVar4;
            pDVar15[1].pBt = pBVar2;
            pDVar15->safety_level = uVar8;
            pDVar15->bSyncSet = uVar9;
            *(undefined6 *)&pDVar15->field_0x12 = uVar10;
            pDVar15->pSchema = pSVar14;
            pDVar15->zDbSName = pcVar16;
            pDVar15->pBt = pBVar19;
          }
          else {
            pDVar15 = (Db *)sqlite3DbRealloc(db,db->aDb,(long)iVar13 * 0x20 + 0x20);
            if (pDVar15 == (Db *)0x0) {
              return;
            }
          }
          context = local_60;
          db->aDb = pDVar15;
          iVar13 = db->nDb;
          pDVar3 = pDVar15 + iVar13;
          pDVar3->safety_level = '\0';
          pDVar3->bSyncSet = '\0';
          *(undefined6 *)&pDVar3->field_0x12 = 0;
          *(Schema **)(&pDVar3->safety_level + 8) = (Schema *)0x0;
          pDVar15[iVar13].zDbSName = (char *)0x0;
          pDVar15[iVar13].pBt = (Btree *)0x0;
          flags = db->openFlags;
          iVar12 = sqlite3ParseUri(db->pVfs->zName,(char *)zUri,&flags,&pVfs,&zPath,&zErr);
          if (iVar12 != 0) {
            if (iVar12 == 7) {
              sqlite3OomFault(db);
            }
            pcVar16 = zErr;
            sqlite3_result_error(context,zErr,-1);
            sqlite3_free(pcVar16);
            return;
          }
          pDVar15 = pDVar15 + iVar13;
          vfsFlags = flags | 0x100;
          _flags = (Btree *)(CONCAT44(uStack_54,flags) | 0x100);
          local_50 = &pDVar15->pBt;
          local_60 = (sqlite3_context *)zPath;
          iVar13 = sqlite3BtreeOpen(pVfs,zPath,db,local_50,0,vfsFlags);
          db->nDb = db->nDb + 1;
          pcVar16 = sqlite3DbStrDup(db,(char *)z);
          pDVar15->zDbSName = pcVar16;
          db->noSharedCache = '\0';
          if (iVar13 == 0x13) {
            zErrDyn = sqlite3MPrintf(db,"database is already attached");
            iVar13 = 1;
          }
          else if (iVar13 == 0) {
            pBVar19 = *local_50;
            goto LAB_00189a4e;
          }
          pDVar15->safety_level = '\x03';
          goto LAB_00189d0d;
        }
        iVar11 = sqlite3DbIsNamed(db,iDb,(char *)z);
        iDb = iDb + 1;
      } while (iVar11 == 0);
      iVar13 = 0;
      zErrDyn = sqlite3MPrintf(db,"database %s is already in use",z);
      context = local_60;
    }
    else {
      iVar13 = 0;
      zErrDyn = sqlite3MPrintf(db,"too many attached databases - max %d");
    }
    goto LAB_00189aba;
  }
  _flags = (Btree *)0x0;
  pVfs = sqlite3_vfs_find("memdb");
  if (pVfs == (sqlite3_vfs *)0x0) {
    return;
  }
  iVar13 = sqlite3BtreeOpen(pVfs,"x",db,(Btree **)&flags,0,0x100);
  pBVar19 = _flags;
  if (iVar13 != 0) goto LAB_00189add;
  pSVar14 = sqlite3SchemaGet(db,_flags);
  if (pSVar14 == (Schema *)0x0) {
    sqlite3BtreeClose(pBVar19);
    iVar13 = 7;
    goto LAB_00189add;
  }
  bVar1 = (db->init).iDb;
  pDVar15 = db->aDb + bVar1;
  pBVar2 = db->aDb[bVar1].pBt;
  if (pBVar2 != (Btree *)0x0) {
    sqlite3BtreeClose(pBVar2);
  }
  pDVar15->pBt = pBVar19;
  pDVar15->pSchema = pSVar14;
  db->noSharedCache = '\0';
  local_60 = (sqlite3_context *)0x0;
LAB_00189a4e:
  pSVar14 = sqlite3SchemaGet(db,pBVar19);
  pDVar15->pSchema = pSVar14;
  iVar13 = 0;
  if (pSVar14 == (Schema *)0x0) {
    iVar13 = 7;
    uVar18 = 0;
  }
  else {
    uVar20 = (undefined7)((ulong)pBVar19 >> 8);
    if (pSVar14->file_format == '\0') {
      uVar18 = (undefined4)CONCAT71(uVar20,1);
    }
    else {
      uVar18 = (undefined4)CONCAT71(uVar20,1);
      if (pSVar14->enc != db->enc) {
        uVar18 = 0;
        zErrDyn = sqlite3MPrintf(db,
                                 "attached databases must use the same text encoding as main database"
                                );
        iVar13 = 1;
      }
    }
  }
  local_50 = (Btree **)CONCAT44(local_50._4_4_,uVar18);
  sqlite3BtreeEnter(pDVar15->pBt);
  sqlite3PagerLockingMode(pDVar15->pBt->pBt->pPager,(uint)db->dfltLockMode);
  pBVar19 = pDVar15->pBt;
  iVar12 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
  sqlite3BtreeSecureDelete(pBVar19,iVar12);
  sqlite3BtreeSetPagerFlags(pDVar15->pBt,(uint)db->flags & 0x38 | 3);
  sqlite3BtreeLeave(pDVar15->pBt);
  pDVar15->safety_level = '\x03';
  if (((char)local_50 != '\0') && (iVar13 = 7, pDVar15->zDbSName != (char *)0x0)) {
    iVar13 = 0;
  }
LAB_00189d0d:
  sqlite3_free_filename((char *)local_60);
  if (iVar13 == 0) {
    sqlite3BtreeEnterAll(db);
    (db->init).iDb = '\0';
    *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xef;
    iVar13 = 0;
    if (((db->init).field_0x6 & 4) == 0) {
      iVar13 = sqlite3Init(db,&zErrDyn);
    }
    sqlite3BtreeLeaveAll(db);
    if (iVar13 == 0) {
      return;
    }
  }
  if (((db->init).field_0x6 & 4) == 0) {
    lVar17 = (long)db->nDb + -1;
    pBVar19 = db->aDb[lVar17].pBt;
    if (pBVar19 != (Btree *)0x0) {
      sqlite3BtreeClose(pBVar19);
      pDVar15 = db->aDb;
      pDVar15[lVar17].pBt = (Btree *)0x0;
      pDVar15[lVar17].pSchema = (Schema *)0x0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = (int)lVar17;
    if ((iVar13 == 0xc0a) || (iVar13 == 7)) {
      sqlite3OomFault(db);
      sqlite3DbFree(db,zErrDyn);
      zErrDyn = sqlite3MPrintf(db,"out of memory");
      goto LAB_00189aba;
    }
    if (zErrDyn == (char *)0x0) {
      zErrDyn = sqlite3MPrintf(db,"unable to open database: %s",zUri);
      goto LAB_00189aba;
    }
LAB_00189abf:
    sqlite3_result_error(context,zErrDyn,-1);
    sqlite3DbFree(db,zErrDyn);
  }
  else {
LAB_00189aba:
    if (zErrDyn != (char *)0x0) goto LAB_00189abf;
  }
  if (iVar13 == 0) {
    return;
  }
LAB_00189add:
  sqlite3_result_error_code(context,iVar13);
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew = 0;             /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);
  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

#ifndef SQLITE_OMIT_DESERIALIZE
# define REOPEN_AS_MEMDB(db)  (db->init.reopenMemdb)
#else
# define REOPEN_AS_MEMDB(db)  (0)
#endif

  if( REOPEN_AS_MEMDB(db) ){
    /* This is not a real ATTACH.  Instead, this routine is being called
    ** from sqlite3_deserialize() to close database db->init.iDb and
    ** reopen it as a MemDB */
    Btree *pNewBt = 0;
    pVfs = sqlite3_vfs_find("memdb");
    if( pVfs==0 ) return;
    rc = sqlite3BtreeOpen(pVfs, "x\0", db, &pNewBt, 0, SQLITE_OPEN_MAIN_DB);
    if( rc==SQLITE_OK ){
      Schema *pNewSchema = sqlite3SchemaGet(db, pNewBt);
      if( pNewSchema ){
        /* Both the Btree and the new Schema were allocated successfully.
        ** Close the old db and update the aDb[] slot with the new memdb
        ** values.  */
        pNew = &db->aDb[db->init.iDb];
        if( ALWAYS(pNew->pBt) ) sqlite3BtreeClose(pNew->pBt);
        pNew->pBt = pNewBt;
        pNew->pSchema = pNewSchema;
      }else{
        sqlite3BtreeClose(pNewBt);
        rc = SQLITE_NOMEM;
      }
    }
    if( rc ) goto attach_error;
  }else{
    /* This is a real ATTACH
    **
    ** Check for the following errors:
    **
    **     * Too many attached databases,
    **     * Transaction currently open
    **     * Specified database name already being used.
    */
    if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
      zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d",
        db->aLimit[SQLITE_LIMIT_ATTACHED]
      );
      goto attach_error;
    }
    for(i=0; i<db->nDb; i++){
      assert( zName );
      if( sqlite3DbIsNamed(db, i, zName) ){
        zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
        goto attach_error;
      }
    }

    /* Allocate the new entry in the db->aDb[] array and initialize the schema
    ** hash tables.
    */
    if( db->aDb==db->aDbStatic ){
      aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
      if( aNew==0 ) return;
      memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
    }else{
      aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
      if( aNew==0 ) return;
    }
    db->aDb = aNew;
    pNew = &db->aDb[db->nDb];
    memset(pNew, 0, sizeof(*pNew));

    /* Open the database file. If the btree is successfully opened, use
    ** it to obtain the database schema. At this point the schema may
    ** or may not be initialized.
    */
    flags = db->openFlags;
    rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
    assert( pVfs );
    flags |= SQLITE_OPEN_MAIN_DB;
    rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
    db->nDb++;
    pNew->zDbSName = sqlite3DbStrDup(db, zName);
  }
  db->noSharedCache = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db,
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3_free_filename( zPath );

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and
  ** remove the entry from the db->aDb[] array. i.e. put everything back the
  ** way we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    db->init.iDb = 0;
    db->mDbFlags &= ~(DBFLAG_SchemaKnownOk);
    if( !REOPEN_AS_MEMDB(db) ){
      rc = sqlite3Init(db, &zErrDyn);
    }
    sqlite3BtreeLeaveAll(db);
    assert( zErrDyn==0 || rc!=SQLITE_OK );
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK && !REOPEN_AS_MEMDB(db) ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    if( ALWAYS(!REOPEN_AS_MEMDB(db)) ){
      int iDb = db->nDb - 1;
      assert( iDb>=2 );
      if( db->aDb[iDb].pBt ){
        sqlite3BtreeClose(db->aDb[iDb].pBt);
        db->aDb[iDb].pBt = 0;
        db->aDb[iDb].pSchema = 0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = iDb;
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        sqlite3DbFree(db, zErrDyn);
        zErrDyn = sqlite3MPrintf(db, "out of memory");
      }else if( zErrDyn==0 ){
        zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
      }
    }
    goto attach_error;
  }

  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}